

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TCMallocTest_ManyThreads_Test::TestBody(TCMallocTest_ManyThreads_Test *this)

{
  bool bVar1;
  reference this_00;
  thread *t;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  int local_5c;
  undefined1 local_58 [4];
  int i_1;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int local_38;
  int i;
  undefined1 local_28 [8];
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ptrs;
  TCMallocTest_ManyThreads_Test *this_local;
  
  ptrs.
  super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  printf("Testing threaded allocation/deallocation (%d threads)\n",10);
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::vector((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
            *)local_28);
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::reserve((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)local_28,10);
  for (local_38 = 0; local_38 < 10; local_38 = local_38 + 1) {
    std::
    make_unique<TesterThread,std::vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>&,int&>
              ((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,(int *)local_28);
    std::
    vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
    ::emplace_back<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>
              ((vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
                *)local_28,
               (unique_ptr<TesterThread,_std::default_delete<TesterThread>_> *)
               &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>::~unique_ptr
              ((unique_ptr<TesterThread,_std::default_delete<TesterThread>_> *)
               &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_58,10);
  for (local_5c = 0; local_5c < 10; local_5c = local_5c + 1) {
    this_00 = std::
              vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
              ::operator[]((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                            *)local_28,(long)local_5c);
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)
               std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>::get(this_00);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<TCMallocTest_ManyThreads_Test::TestBody()::__0>
              ((vector<std::thread,std::allocator<std::thread>> *)local_58,(type *)&__range1);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  t = (thread *)
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&t);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_58);
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::~vector((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(TCMallocTest, ManyThreads) {
  printf("Testing threaded allocation/deallocation (%d threads)\n",
          FLAGS_numthreads);

  std::vector<std::unique_ptr<TesterThread>> ptrs;
  ptrs.reserve(FLAGS_numthreads);
  // Note, the logic inside PassObject requires us to create all
  // TesterThreads first, before starting any of them.
  for (int i = 0; i < FLAGS_numthreads; i++) {
    ptrs.emplace_back(std::make_unique<TesterThread>(ptrs, i));
  }

  std::vector<std::thread> threads;
  threads.reserve(FLAGS_numthreads);
  for (int i = 0; i < FLAGS_numthreads; i++) {
    threads.emplace_back([thr = ptrs[i].get()] () {
      thr->Run();
    });
  }
  for (auto& t : threads) {
    t.join();
  }
}